

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::MapValueRefDataOnlyByteSize
                 (FieldDescriptor *field,MapValueRef *value)

{
  Type TVar1;
  uint32 value_00;
  int32 iVar2;
  int value_01;
  uint64 value_02;
  int64 iVar3;
  string *psVar4;
  MessageLite *value_03;
  LogMessage *pLVar5;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [13];
  LogMessage local_58;
  MapValueRef *local_20;
  MapValueRef *value_local;
  FieldDescriptor *field_local;
  
  local_20 = value;
  value_local = (MapValueRef *)field;
  TVar1 = FieldDescriptor::type(field);
  switch(TVar1) {
  case TYPE_DOUBLE:
    field_local = (FieldDescriptor *)0x8;
    break;
  case TYPE_FLOAT:
    field_local = (FieldDescriptor *)0x4;
    break;
  case TYPE_INT64:
    iVar3 = MapValueRef::GetInt64Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::Int64Size(iVar3);
    break;
  case TYPE_UINT64:
    value_02 = MapValueRef::GetUInt64Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::UInt64Size(value_02);
    break;
  case TYPE_INT32:
    iVar2 = MapValueRef::GetInt32Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::Int32Size(iVar2);
    break;
  case TYPE_FIXED64:
    field_local = (FieldDescriptor *)0x8;
    break;
  case TYPE_FIXED32:
    field_local = (FieldDescriptor *)0x4;
    break;
  case TYPE_BOOL:
    field_local = (FieldDescriptor *)0x1;
    break;
  case TYPE_STRING:
    psVar4 = MapValueRef::GetStringValue_abi_cxx11_(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::StringSize(psVar4);
    break;
  case TYPE_GROUP:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x500);
    pLVar5 = LogMessage::operator<<(&local_58,"Unsupported");
    LogFinisher::operator=(local_65,pLVar5);
    LogMessage::~LogMessage(&local_58);
    field_local = (FieldDescriptor *)0x0;
    break;
  case TYPE_MESSAGE:
    value_03 = &MapValueRef::GetMessageValue(local_20)->super_MessageLite;
    field_local = (FieldDescriptor *)WireFormatLite::MessageSize(value_03);
    break;
  case TYPE_BYTES:
    psVar4 = MapValueRef::GetStringValue_abi_cxx11_(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::BytesSize(psVar4);
    break;
  case TYPE_UINT32:
    value_00 = MapValueRef::GetUInt32Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::UInt32Size(value_00);
    break;
  case TYPE_ENUM:
    value_01 = MapValueRef::GetEnumValue(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::EnumSize(value_01);
    break;
  case TYPE_SFIXED32:
    field_local = (FieldDescriptor *)0x4;
    break;
  case TYPE_SFIXED64:
    field_local = (FieldDescriptor *)0x8;
    break;
  case TYPE_SINT32:
    iVar2 = MapValueRef::GetInt32Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::SInt32Size(iVar2);
    break;
  case MAX_TYPE:
    iVar3 = MapValueRef::GetInt64Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::SInt64Size(iVar3);
    break;
  default:
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x520);
    pLVar5 = LogMessage::operator<<(&local_a0,"Cannot get here");
    LogFinisher::operator=(&local_a1,pLVar5);
    LogMessage::~LogMessage(&local_a0);
    field_local = (FieldDescriptor *)0x0;
  }
  return (size_t)field_local;
}

Assistant:

static size_t MapValueRefDataOnlyByteSize(const FieldDescriptor* field,
                                          const MapValueRef& value) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_GROUP:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      CASE_TYPE(BYTES, Bytes, String);
      CASE_TYPE(ENUM, Enum, Enum);
      CASE_TYPE(MESSAGE, Message, Message);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(DOUBLE, Double);
      FIXED_CASE_TYPE(FLOAT, Float);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}